

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cpp
# Opt level: O2

int __thiscall ncnn::Scale::load_model(Scale *this,ModelBin *mb)

{
  Mat local_60;
  
  if (this->scale_data_size != 0xffffff17) {
    (**mb->_vptr_ModelBin)(&local_60,mb,(ulong)(uint)this->scale_data_size,1);
    Mat::operator=(&this->scale_data,&local_60);
    Mat::~Mat(&local_60);
    if ((this->scale_data).data == (void *)0x0) {
      return -100;
    }
    if ((long)(this->scale_data).c * (this->scale_data).cstep == 0) {
      return -100;
    }
  }
  if (this->bias_term != 0) {
    (**mb->_vptr_ModelBin)(&local_60,mb,(ulong)(uint)this->scale_data_size,1);
    Mat::operator=(&this->bias_data,&local_60);
    Mat::~Mat(&local_60);
    if ((this->bias_data).data == (void *)0x0) {
      return -100;
    }
    if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int Scale::load_model(const ModelBin& mb)
{
    if (scale_data_size != -233)
    {
        scale_data = mb.load(scale_data_size, 1);
        if (scale_data.empty())
            return -100;
    }

    if (bias_term)
    {
        bias_data = mb.load(scale_data_size, 1);
        if (bias_data.empty())
            return -100;
    }

    return 0;
}